

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjCompressFromYUVPlanes
              (tjhandle handle,uchar **srcPlanes,int width,int *strides,int height,int subsamp,
              uchar **jpegBuf,unsigned_long *jpegSize,int jpegQual,int flags)

{
  int iVar1;
  unsigned_long uVar2;
  void *pvVar3;
  long in_RCX;
  int in_EDX;
  long *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  long *in_FS_OFFSET;
  long in_stack_00000008;
  int k;
  int j;
  jpeg_component_info *compptr_1;
  int crow [10];
  JSAMPARRAY yuvptr [10];
  int ih;
  jpeg_component_info *compptr;
  j_compress_ptr cinfo;
  tjinstance *this;
  JSAMPROW *tmpbuf [10];
  JSAMPROW *inbuf [10];
  JSAMPLE *ptr;
  JSAMPLE *_tmpbuf;
  int th [10];
  int usetmpbuf;
  int tmpbufsize;
  int iw [10];
  int ph [10];
  int pw [10];
  int alloc;
  int retval;
  int row;
  int i;
  JDIMENSION in_stack_fffffffffffffd9c;
  int in_stack_fffffffffffffda0;
  uint in_stack_fffffffffffffda4;
  uint in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  jpeg_compress_struct *in_stack_fffffffffffffdb0;
  int aiStack_248 [12];
  long local_218 [10];
  uint local_1c4;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long alStack_1a8 [10];
  long alStack_158 [10];
  void *local_108;
  void *local_100;
  JDIMENSION aJStack_f8 [10];
  int local_d0;
  int local_cc;
  uint auStack_c8 [12];
  uint auStack_98 [12];
  uint auStack_68 [10];
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_2c;
  long local_28;
  int local_1c;
  long *local_18;
  
  local_3c = 0;
  local_40 = 1;
  local_cc = 0;
  local_d0 = 0;
  local_100 = (void *)0x0;
  local_1b8 = 0;
  if (in_RDI == 0) {
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"Invalid handle");
    return -1;
  }
  *(undefined4 *)(in_RDI + 0x5f8) = 0;
  *(undefined4 *)(in_RDI + 0x6d0) = 0;
  *(uint *)(in_RDI + 0x5fc) = (uint)((crow[0] & 0x2000U) != 0);
  for (local_34 = 0; local_34 < 10; local_34 = local_34 + 1) {
    alStack_1a8[local_34] = 0;
    alStack_158[local_34] = 0;
  }
  local_1b8 = in_RDI;
  local_1b0 = in_RDI;
  if ((*(uint *)(in_RDI + 0x600) & 1) == 0) {
    snprintf((char *)(in_RDI + 0x608),200,"%s",
             "tjCompressFromYUVPlanes(): Instance has not been initialized for compression");
    *(undefined4 *)(local_1b0 + 0x6d0) = 1;
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
             "tjCompressFromYUVPlanes(): Instance has not been initialized for compression");
    local_3c = -1;
  }
  else if (((((((in_RSI == (long *)0x0) || (*in_RSI == 0)) || (in_EDX < 1)) ||
             ((in_R8D < 1 || (in_R9D < 0)))) ||
            ((5 < in_R9D || ((in_stack_00000008 == 0 || (_k == (unsigned_long *)0x0)))))) ||
           ((int)compptr_1 < 0)) || (100 < (int)compptr_1)) {
    snprintf((char *)(in_RDI + 0x608),200,"%s","tjCompressFromYUVPlanes(): Invalid argument");
    *(undefined4 *)(local_1b0 + 0x6d0) = 1;
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s","tjCompressFromYUVPlanes(): Invalid argument")
    ;
    local_3c = -1;
  }
  else if ((in_R9D == 3) || ((in_RSI[1] != 0 && (in_RSI[2] != 0)))) {
    local_2c = in_R8D;
    local_28 = in_RCX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    iVar1 = _setjmp((__jmp_buf_tag *)(in_RDI + 0x528));
    if (iVar1 == 0) {
      *(int *)(local_1b8 + 0x30) = local_1c;
      *(int *)(local_1b8 + 0x34) = local_2c;
      if ((crow[0] & 8U) == 0) {
        if ((crow[0] & 0x10U) == 0) {
          if ((crow[0] & 0x20U) != 0) {
            putenv("JSIMD_FORCESSE2=1");
          }
        }
        else {
          putenv("JSIMD_FORCESSE=1");
        }
      }
      else {
        putenv("JSIMD_FORCEMMX=1");
      }
      if ((crow[0] & 0x400U) != 0) {
        local_40 = 0;
        uVar2 = tjBufSize((int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                          (int)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        *_k = uVar2;
      }
      jpeg_mem_dest_tj(in_stack_fffffffffffffdb0,
                       (uchar **)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                       (unsigned_long *)
                       CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                       in_stack_fffffffffffffd9c);
      setCompDefaults(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda8,
                      in_stack_fffffffffffffda4,in_stack_fffffffffffffda0);
      *(undefined4 *)(local_1b8 + 0x100) = 1;
      jpeg_start_compress((j_compress_ptr)
                          CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                          in_stack_fffffffffffffd9c);
      for (local_34 = 0; local_34 < *(int *)(local_1b8 + 0x4c); local_34 = local_34 + 1) {
        local_1c0 = *(long *)(local_1b8 + 0x58) + (long)local_34 * 0x60;
        auStack_c8[local_34] = *(int *)(local_1c0 + 0x1c) << 3;
        local_1c4 = *(int *)(local_1c0 + 0x20) << 3;
        auStack_68[local_34] =
             (((*(int *)(local_1b8 + 0x30) + *(int *)(local_1b8 + 0x138)) - 1U &
              (*(int *)(local_1b8 + 0x138) - 1U ^ 0xffffffff)) * *(int *)(local_1c0 + 8)) /
             *(uint *)(local_1b8 + 0x138);
        auStack_98[local_34] =
             (((*(int *)(local_1b8 + 0x34) + *(int *)(local_1b8 + 0x13c)) - 1U &
              (*(int *)(local_1b8 + 0x13c) - 1U ^ 0xffffffff)) * *(int *)(local_1c0 + 0xc)) /
             *(uint *)(local_1b8 + 0x13c);
        if ((auStack_c8[local_34] != auStack_68[local_34]) || (local_1c4 != auStack_98[local_34])) {
          local_d0 = 1;
        }
        aJStack_f8[local_34] = *(int *)(local_1c0 + 0xc) << 3;
        local_cc = auStack_c8[local_34] * aJStack_f8[local_34] + local_cc;
        pvVar3 = malloc((long)(int)auStack_98[local_34] << 3);
        alStack_158[local_34] = (long)pvVar3;
        if (pvVar3 == (void *)0x0) {
          snprintf((char *)(local_1b0 + 0x608),200,"%s",
                   "tjCompressFromYUVPlanes(): Memory allocation failure");
          *(undefined4 *)(local_1b0 + 0x6d0) = 1;
          snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                   "tjCompressFromYUVPlanes(): Memory allocation failure");
          local_3c = -1;
          goto LAB_00110405;
        }
        local_108 = (void *)local_18[local_34];
        for (local_38 = 0; local_38 < (int)auStack_98[local_34]; local_38 = local_38 + 1) {
          *(void **)(alStack_158[local_34] + (long)local_38 * 8) = local_108;
          if ((local_28 == 0) || (*(int *)(local_28 + (long)local_34 * 4) == 0)) {
            in_stack_fffffffffffffda4 = auStack_68[local_34];
          }
          else {
            in_stack_fffffffffffffda4 = *(uint *)(local_28 + (long)local_34 * 4);
          }
          local_108 = (void *)((long)local_108 + (long)(int)in_stack_fffffffffffffda4);
        }
      }
      if (local_d0 != 0) {
        local_100 = malloc((long)local_cc);
        if (local_100 == (void *)0x0) {
          snprintf((char *)(local_1b0 + 0x608),200,"%s",
                   "tjCompressFromYUVPlanes(): Memory allocation failure");
          *(undefined4 *)(local_1b0 + 0x6d0) = 1;
          snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                   "tjCompressFromYUVPlanes(): Memory allocation failure");
          local_3c = -1;
          goto LAB_00110405;
        }
        local_108 = local_100;
        for (local_34 = 0; local_34 < *(int *)(local_1b8 + 0x4c); local_34 = local_34 + 1) {
          pvVar3 = malloc((long)(int)aJStack_f8[local_34] << 3);
          alStack_1a8[local_34] = (long)pvVar3;
          if (pvVar3 == (void *)0x0) {
            snprintf((char *)(local_1b0 + 0x608),200,"%s",
                     "tjCompressFromYUVPlanes(): Memory allocation failure");
            *(undefined4 *)(local_1b0 + 0x6d0) = 1;
            snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                     "tjCompressFromYUVPlanes(): Memory allocation failure");
            local_3c = -1;
            goto LAB_00110405;
          }
          for (local_38 = 0; local_38 < (int)aJStack_f8[local_34]; local_38 = local_38 + 1) {
            *(void **)(alStack_1a8[local_34] + (long)local_38 * 8) = local_108;
            local_108 = (void *)((long)local_108 + (long)(int)auStack_c8[local_34]);
          }
        }
      }
      iVar1 = _setjmp((__jmp_buf_tag *)(local_1b0 + 0x528));
      if (iVar1 == 0) {
        for (local_38 = 0; local_38 < *(int *)(local_1b8 + 0x34);
            local_38 = *(int *)(local_1b8 + 0x13c) * 8 + local_38) {
          for (local_34 = 0; local_34 < *(int *)(local_1b8 + 0x4c); local_34 = local_34 + 1) {
            aiStack_248[local_34] =
                 (local_38 * *(int *)(*(long *)(local_1b8 + 0x58) + (long)local_34 * 0x60 + 0xc)) /
                 *(int *)(local_1b8 + 0x13c);
            if (local_d0 == 0) {
              local_218[local_34] = alStack_158[local_34] + (long)aiStack_248[local_34] * 8;
            }
            else {
              in_stack_fffffffffffffda0 = 0;
              while( true ) {
                if ((int)aJStack_f8[local_34] < (int)(auStack_98[local_34] - aiStack_248[local_34]))
                {
                  in_stack_fffffffffffffd9c = aJStack_f8[local_34];
                }
                else {
                  in_stack_fffffffffffffd9c = auStack_98[local_34] - aiStack_248[local_34];
                }
                if ((int)in_stack_fffffffffffffd9c <= in_stack_fffffffffffffda0) break;
                memcpy(*(void **)(alStack_1a8[local_34] + (long)in_stack_fffffffffffffda0 * 8),
                       *(void **)(alStack_158[local_34] +
                                 (long)(aiStack_248[local_34] + in_stack_fffffffffffffda0) * 8),
                       (long)(int)auStack_68[local_34]);
                for (in_stack_fffffffffffffda8 = auStack_68[local_34];
                    (int)in_stack_fffffffffffffda8 < (int)auStack_c8[local_34];
                    in_stack_fffffffffffffda8 = in_stack_fffffffffffffda8 + 1) {
                  *(undefined1 *)
                   (*(long *)(alStack_1a8[local_34] + (long)in_stack_fffffffffffffda0 * 8) +
                   (long)(int)in_stack_fffffffffffffda8) =
                       *(undefined1 *)
                        (*(long *)(alStack_1a8[local_34] + (long)in_stack_fffffffffffffda0 * 8) +
                        (long)(int)(auStack_68[local_34] - 1));
                }
                in_stack_fffffffffffffda0 = in_stack_fffffffffffffda0 + 1;
              }
              for (in_stack_fffffffffffffdac = auStack_98[local_34] - aiStack_248[local_34];
                  in_stack_fffffffffffffdac < (int)aJStack_f8[local_34];
                  in_stack_fffffffffffffdac = in_stack_fffffffffffffdac + 1) {
                memcpy(*(void **)(alStack_1a8[local_34] + (long)in_stack_fffffffffffffdac * 8),
                       *(void **)(alStack_1a8[local_34] +
                                 (long)(int)((auStack_98[local_34] - aiStack_248[local_34]) + -1) *
                                 8),(long)(int)auStack_c8[local_34]);
              }
              local_218[local_34] = alStack_1a8[local_34];
            }
          }
          jpeg_write_raw_data((j_compress_ptr)
                              CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                              (JSAMPIMAGE)
                              CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                              in_stack_fffffffffffffd9c);
        }
        jpeg_finish_compress
                  ((j_compress_ptr)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      }
      else {
        local_3c = -1;
      }
    }
    else {
      local_3c = -1;
    }
  }
  else {
    snprintf((char *)(in_RDI + 0x608),200,"%s","tjCompressFromYUVPlanes(): Invalid argument");
    *(undefined4 *)(local_1b0 + 0x6d0) = 1;
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s","tjCompressFromYUVPlanes(): Invalid argument")
    ;
    local_3c = -1;
  }
LAB_00110405:
  if (100 < *(int *)(local_1b8 + 0x24)) {
    if (local_40 != 0) {
      (**(code **)(*(long *)(local_1b8 + 0x28) + 0x20))(local_1b8);
    }
    jpeg_abort_compress((j_compress_ptr)0x110444);
  }
  for (local_34 = 0; local_34 < 10; local_34 = local_34 + 1) {
    free((void *)alStack_1a8[local_34]);
    free((void *)alStack_158[local_34]);
  }
  free(local_100);
  if (*(int *)(local_1b0 + 0x5f8) != 0) {
    local_3c = -1;
  }
  *(undefined4 *)(local_1b0 + 0x5fc) = 0;
  return local_3c;
}

Assistant:

DLLEXPORT int tjCompressFromYUVPlanes(tjhandle handle,
                                      const unsigned char **srcPlanes,
                                      int width, const int *strides,
                                      int height, int subsamp,
                                      unsigned char **jpegBuf,
                                      unsigned long *jpegSize, int jpegQual,
                                      int flags)
{
  int i, row, retval = 0, alloc = 1;
  int pw[MAX_COMPONENTS], ph[MAX_COMPONENTS], iw[MAX_COMPONENTS],
    tmpbufsize = 0, usetmpbuf = 0, th[MAX_COMPONENTS];
  JSAMPLE *_tmpbuf = NULL, *ptr;
  JSAMPROW *inbuf[MAX_COMPONENTS], *tmpbuf[MAX_COMPONENTS];

  GET_CINSTANCE(handle)
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  for (i = 0; i < MAX_COMPONENTS; i++) {
    tmpbuf[i] = NULL;  inbuf[i] = NULL;
  }

  if ((this->init & COMPRESS) == 0)
    THROW("tjCompressFromYUVPlanes(): Instance has not been initialized for compression");

  if (!srcPlanes || !srcPlanes[0] || width <= 0 || height <= 0 ||
      subsamp < 0 || subsamp >= NUMSUBOPT || jpegBuf == NULL ||
      jpegSize == NULL || jpegQual < 0 || jpegQual > 100)
    THROW("tjCompressFromYUVPlanes(): Invalid argument");
  if (subsamp != TJSAMP_GRAY && (!srcPlanes[1] || !srcPlanes[2]))
    THROW("tjCompressFromYUVPlanes(): Invalid argument");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  cinfo->image_width = width;
  cinfo->image_height = height;

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_NOREALLOC) {
    alloc = 0;  *jpegSize = tjBufSize(width, height, subsamp);
  }
  jpeg_mem_dest_tj(cinfo, jpegBuf, jpegSize, alloc);
  setCompDefaults(cinfo, TJPF_RGB, subsamp, jpegQual, flags);
  cinfo->raw_data_in = TRUE;

  jpeg_start_compress(cinfo, TRUE);
  for (i = 0; i < cinfo->num_components; i++) {
    jpeg_component_info *compptr = &cinfo->comp_info[i];
    int ih;

    iw[i] = compptr->width_in_blocks * DCTSIZE;
    ih = compptr->height_in_blocks * DCTSIZE;
    pw[i] = PAD(cinfo->image_width, cinfo->max_h_samp_factor) *
            compptr->h_samp_factor / cinfo->max_h_samp_factor;
    ph[i] = PAD(cinfo->image_height, cinfo->max_v_samp_factor) *
            compptr->v_samp_factor / cinfo->max_v_samp_factor;
    if (iw[i] != pw[i] || ih != ph[i]) usetmpbuf = 1;
    th[i] = compptr->v_samp_factor * DCTSIZE;
    tmpbufsize += iw[i] * th[i];
    if ((inbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph[i])) == NULL)
      THROW("tjCompressFromYUVPlanes(): Memory allocation failure");
    ptr = (JSAMPLE *)srcPlanes[i];
    for (row = 0; row < ph[i]; row++) {
      inbuf[i][row] = ptr;
      ptr += (strides && strides[i] != 0) ? strides[i] : pw[i];
    }
  }
  if (usetmpbuf) {
    if ((_tmpbuf = (JSAMPLE *)malloc(sizeof(JSAMPLE) * tmpbufsize)) == NULL)
      THROW("tjCompressFromYUVPlanes(): Memory allocation failure");
    ptr = _tmpbuf;
    for (i = 0; i < cinfo->num_components; i++) {
      if ((tmpbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * th[i])) == NULL)
        THROW("tjCompressFromYUVPlanes(): Memory allocation failure");
      for (row = 0; row < th[i]; row++) {
        tmpbuf[i][row] = ptr;
        ptr += iw[i];
      }
    }
  }

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  for (row = 0; row < (int)cinfo->image_height;
       row += cinfo->max_v_samp_factor * DCTSIZE) {
    JSAMPARRAY yuvptr[MAX_COMPONENTS];
    int crow[MAX_COMPONENTS];

    for (i = 0; i < cinfo->num_components; i++) {
      jpeg_component_info *compptr = &cinfo->comp_info[i];

      crow[i] = row * compptr->v_samp_factor / cinfo->max_v_samp_factor;
      if (usetmpbuf) {
        int j, k;

        for (j = 0; j < MIN(th[i], ph[i] - crow[i]); j++) {
          memcpy(tmpbuf[i][j], inbuf[i][crow[i] + j], pw[i]);
          /* Duplicate last sample in row to fill out MCU */
          for (k = pw[i]; k < iw[i]; k++)
            tmpbuf[i][j][k] = tmpbuf[i][j][pw[i] - 1];
        }
        /* Duplicate last row to fill out MCU */
        for (j = ph[i] - crow[i]; j < th[i]; j++)
          memcpy(tmpbuf[i][j], tmpbuf[i][ph[i] - crow[i] - 1], iw[i]);
        yuvptr[i] = tmpbuf[i];
      } else
        yuvptr[i] = &inbuf[i][crow[i]];
    }
    jpeg_write_raw_data(cinfo, yuvptr, cinfo->max_v_samp_factor * DCTSIZE);
  }
  jpeg_finish_compress(cinfo);

bailout:
  if (cinfo->global_state > CSTATE_START) {
    if (alloc) (*cinfo->dest->term_destination) (cinfo);
    jpeg_abort_compress(cinfo);
  }
  for (i = 0; i < MAX_COMPONENTS; i++) {
    free(tmpbuf[i]);
    free(inbuf[i]);
  }
  free(_tmpbuf);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}